

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3Fts5HashClear(Fts5Hash *pHash)

{
  Fts5HashEntry *pFVar1;
  int iVar2;
  long lVar3;
  Fts5HashEntry *p;
  long lVar4;
  
  iVar2 = pHash->nSlot;
  lVar3 = (long)iVar2;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      p = pHash->aSlot[lVar4];
      if (pHash->aSlot[lVar4] != (Fts5HashEntry *)0x0) {
        do {
          pFVar1 = p->pHashNext;
          sqlite3_free(p);
          p = pFVar1;
        } while (pFVar1 != (Fts5HashEntry *)0x0);
        iVar2 = pHash->nSlot;
      }
      lVar4 = lVar4 + 1;
      lVar3 = (long)iVar2;
    } while (lVar4 < lVar3);
  }
  memset(pHash->aSlot,0,lVar3 << 3);
  pHash->nEntry = 0;
  return;
}

Assistant:

static void sqlite3Fts5HashClear(Fts5Hash *pHash){
  int i;
  for(i=0; i<pHash->nSlot; i++){
    Fts5HashEntry *pNext;
    Fts5HashEntry *pSlot;
    for(pSlot=pHash->aSlot[i]; pSlot; pSlot=pNext){
      pNext = pSlot->pHashNext;
      sqlite3_free(pSlot);
    }
  }
  memset(pHash->aSlot, 0, pHash->nSlot * sizeof(Fts5HashEntry*));
  pHash->nEntry = 0;
}